

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# worker.c
# Opt level: O3

int worker_join(worker_handle *wh)

{
  condvar_handle *condvar;
  uint uVar1;
  int iVar2;
  
  condvar = (condvar_handle *)wh->priv;
  mutex_lock((mutex_handle *)(condvar + 2));
  uVar1 = *(uint *)&condvar[7].priv;
  if (2 < uVar1) {
    if (uVar1 == 5) {
      condvar_wake_all(condvar);
      uVar1 = *(uint *)&condvar[7].priv;
    }
    *(uint *)&condvar[7].priv = (uVar1 == 4) + 1;
  }
  condvar_wake_all(condvar + 1);
  mutex_unlock((mutex_handle *)(condvar + 2));
  iVar2 = thread_join((thread_handle *)(condvar + 3));
  return iVar2;
}

Assistant:

int worker_join(struct worker_handle *wh)
{
	struct worker_priv *priv = wh->priv;

	mutex_lock(&priv->mutex);

	if (priv->state > WORKER_STOPPING_AFTER_WORK) {
		if (priv->state == WORKER_IDLE)
			condvar_wake_all(&priv->condvar);

		if (priv->state == WORKER_SIGNALED)
			priv->state = WORKER_STOPPING_AFTER_WORK;
		else
			priv->state = WORKER_STOPPING;
	}

	condvar_wake_all(&priv->condvar_idle);

	mutex_unlock(&priv->mutex);

	return thread_join(&priv->thread);
}